

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLimits.cpp
# Opt level: O0

void __thiscall
glcts::GeometryShaderMaxCombinedTextureUnitsTest::getShaderParts
          (GeometryShaderMaxCombinedTextureUnitsTest *this,GLchar ***out_fragment_shader_parts,
          uint *out_n_fragment_shader_parts,GLchar ***out_geometry_shader_parts,
          uint *out_n_geometry_shader_parts,GLchar ***out_vertex_shader_parts,
          uint *out_n_vertex_shader_parts)

{
  int iVar1;
  deUint32 err;
  int iVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  GLchar *pGVar4;
  string local_548 [32];
  stringstream local_528 [8];
  stringstream stream_vertex;
  undefined1 local_518 [376];
  string local_3a0 [32];
  stringstream local_380 [8];
  stringstream stream_geometry;
  undefined1 local_370 [376];
  string local_1f8 [48];
  stringstream local_1c8 [8];
  stringstream stream_fragment;
  undefined1 local_1b8 [376];
  long local_40;
  Functions *gl;
  GLchar ***out_vertex_shader_parts_local;
  uint *out_n_geometry_shader_parts_local;
  GLchar ***out_geometry_shader_parts_local;
  uint *out_n_fragment_shader_parts_local;
  GLchar ***out_fragment_shader_parts_local;
  GeometryShaderMaxCombinedTextureUnitsTest *this_local;
  
  gl = (Functions *)out_vertex_shader_parts;
  out_vertex_shader_parts_local = (GLchar ***)out_n_geometry_shader_parts;
  out_n_geometry_shader_parts_local = (uint *)out_geometry_shader_parts;
  out_geometry_shader_parts_local = (GLchar ***)out_n_fragment_shader_parts;
  out_n_fragment_shader_parts_local = (uint *)out_fragment_shader_parts;
  out_fragment_shader_parts_local = (GLchar ***)this;
  pRVar3 = deqp::Context::getRenderContext
                     ((this->super_GeometryShaderLimitsRenderingBase).super_TestCaseBase.m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  local_40 = CONCAT44(extraout_var,iVar1);
  (**(code **)(local_40 + 0x868))(0x8b4d,&this->m_max_combined_texture_units);
  (**(code **)(local_40 + 0x868))(0x8b4c,&this->m_max_vertex_texture_units);
  (**(code **)(local_40 + 0x868))
            ((this->super_GeometryShaderLimitsRenderingBase).super_TestCaseBase.m_glExtTokens.
             MAX_GEOMETRY_TEXTURE_IMAGE_UNITS,&this->m_max_geometry_texture_units);
  (**(code **)(local_40 + 0x868))(0x8872,&this->m_max_fragment_texture_units);
  err = (**(code **)(local_40 + 0x800))();
  glu::checkError(err,"glGetIntegerv() call(s) failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                  ,0xc2e);
  iVar1 = this->m_max_vertex_texture_units;
  iVar2 = de::max<int>(this->m_max_geometry_texture_units,this->m_max_fragment_texture_units);
  iVar1 = de::max<int>(iVar1,iVar2);
  this->m_n_texture_units = iVar1;
  iVar1 = de::min<int>(this->m_max_combined_texture_units + -2,this->m_max_vertex_texture_units);
  iVar1 = de::max<int>(1,iVar1);
  this->m_n_vertex_texture_units = iVar1;
  iVar1 = de::min<int>(~this->m_n_vertex_texture_units + this->m_max_combined_texture_units,
                       this->m_max_fragment_texture_units);
  iVar1 = de::max<int>(1,iVar1);
  this->m_n_fragment_texture_units = iVar1;
  iVar1 = de::min<int>((this->m_max_combined_texture_units - this->m_n_vertex_texture_units) -
                       this->m_n_fragment_texture_units,this->m_max_geometry_texture_units);
  iVar1 = de::max<int>(1,iVar1);
  this->m_n_geometry_texture_units = iVar1;
  iVar1 = this->m_n_vertex_texture_units;
  iVar2 = de::min<int>(this->m_n_fragment_texture_units,this->m_n_geometry_texture_units);
  iVar1 = de::min<int>(iVar1,iVar2);
  this->m_min_texture_units = iVar1;
  this->m_texture_width = this->m_n_texture_units;
  std::__cxx11::stringstream::stringstream(local_1c8);
  std::ostream::operator<<(local_1b8,this->m_n_fragment_texture_units);
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator=((string *)&this->m_n_fragment_texture_units_string,local_1f8);
  std::__cxx11::string::~string(local_1f8);
  std::__cxx11::stringstream::stringstream(local_380);
  std::ostream::operator<<(local_370,this->m_n_geometry_texture_units);
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator=((string *)&this->m_n_geometry_texture_units_string,local_3a0);
  std::__cxx11::string::~string(local_3a0);
  std::__cxx11::stringstream::stringstream(local_528);
  std::ostream::operator<<(local_518,this->m_n_vertex_texture_units);
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator=((string *)&this->m_n_vertex_texture_units_string,local_548);
  std::__cxx11::string::~string(local_548);
  this->m_fragment_shader_parts[0] =
       "${VERSION}\n\n${GEOMETRY_SHADER_REQUIRE}\n${GPU_SHADER5_ENABLE}\n\nprecision highp float;\n\n// NUMBER_OF_POINTS == NUMBER_OF_SAMPLERS\n#define NUMBER_OF_POINTS "
  ;
  pGVar4 = (GLchar *)std::__cxx11::string::c_str();
  this->m_fragment_shader_parts[1] = pGVar4;
  this->m_fragment_shader_parts[2] =
       "u\n\n                     uniform highp usampler2D sampler[NUMBER_OF_POINTS];\nflat                 in      int        gs_fs_vertex_id;\nflat                 in      uint       gs_fs_vertex_sum;\nflat                 in      uint       gs_fs_geometry_sum;\nlayout(location = 0) out     uint       fs_out_color;\n\nvoid main()\n{\n    uint sum = 0u;\n\n    for (uint i = 0u; i < uint(gs_fs_vertex_id); ++i)\n    {\n        sum += texture(sampler[i], vec2(0.0, 0.0)).r;\n    }\n    fs_out_color = sum + gs_fs_vertex_sum + gs_fs_geometry_sum;\n}\n"
  ;
  *(GLchar ***)out_n_fragment_shader_parts_local = this->m_fragment_shader_parts;
  *(undefined4 *)out_geometry_shader_parts_local = 3;
  this->m_geometry_shader_parts[0] =
       "${VERSION}\n\n${GEOMETRY_SHADER_REQUIRE}\n${GPU_SHADER5_ENABLE}\n\nprecision highp float;\n\nlayout(points)                   in;\nlayout(points, max_vertices = 1) out;\n\n#define NUMBER_OF_POINTS "
  ;
  pGVar4 = (GLchar *)std::__cxx11::string::c_str();
  this->m_geometry_shader_parts[1] = pGVar4;
  this->m_geometry_shader_parts[2] =
       "u\n\n// NUMBER_OF_POINTS == NUMBER_OF_SAMPLERS\n     uniform highp usampler2D sampler[NUMBER_OF_POINTS];\nflat in      int        vs_gs_vertex_id[1];\nflat in      uint       vs_gs_sum      [1];\nflat out     int        gs_fs_vertex_id;\nflat out     uint       gs_fs_vertex_sum;\nflat out     uint       gs_fs_geometry_sum;\n\nvoid main()\n{\n    uint sum = 0u;\n\n    for (uint i = 0u; i < uint(vs_gs_vertex_id[0]); ++i)\n    {\n        sum += texture(sampler[i], vec2(0.0, 0.0)).r;\n    }\n\n    gl_Position        = gl_in[0].gl_Position;\n    gs_fs_vertex_id    = vs_gs_vertex_id[0];\n    gs_fs_vertex_sum   = vs_gs_sum      [0];\n    gs_fs_geometry_sum = sum;\n    EmitVertex();\n    EndPrimitive();\n}\n"
  ;
  *(GLchar ***)out_n_geometry_shader_parts_local = this->m_geometry_shader_parts;
  *(undefined4 *)out_vertex_shader_parts_local = 3;
  this->m_vertex_shader_parts[0] =
       "${VERSION}\n\n${GEOMETRY_SHADER_REQUIRE}\n${GPU_SHADER5_ENABLE}\n\nprecision highp float;\n\n#define NUMBER_OF_POINTS "
  ;
  pGVar4 = (GLchar *)std::__cxx11::string::c_str();
  this->m_vertex_shader_parts[1] = pGVar4;
  this->m_vertex_shader_parts[2] =
       "u\n\n// NUMBER_OF_POINTS == NUMBER_OF_SAMPLERS\n     uniform highp usampler2D sampler[NUMBER_OF_POINTS];flat out     int        vs_gs_vertex_id;\nflat out     uint       vs_gs_sum;\n\nvoid main()\n{\n    uint sum = 0u;\n\n    for (uint i = 0u; i < uint(gl_VertexID); ++i)\n    {\n        sum += texture(sampler[i], vec2(0.0, 0.0)).r;\n    }\n\n    gl_Position     = vec4(-1.0 + ((2.0 / float(NUMBER_OF_POINTS)) * float(gl_VertexID)) + (1.0 / float(NUMBER_OF_POINTS)), 0, 0, 1.0);\n    vs_gs_vertex_id = gl_VertexID;\n    vs_gs_sum       = sum;\n}\n"
  ;
  gl->activeShaderProgram = (glActiveShaderProgramFunc)this->m_vertex_shader_parts;
  *out_n_vertex_shader_parts = 3;
  std::__cxx11::stringstream::~stringstream(local_528);
  std::__cxx11::stringstream::~stringstream(local_380);
  std::__cxx11::stringstream::~stringstream(local_1c8);
  return;
}

Assistant:

void GeometryShaderMaxCombinedTextureUnitsTest::getShaderParts(const glw::GLchar* const*& out_fragment_shader_parts,
															   unsigned int&			  out_n_fragment_shader_parts,
															   const glw::GLchar* const*& out_geometry_shader_parts,
															   unsigned int&			  out_n_geometry_shader_parts,
															   const glw::GLchar* const*& out_vertex_shader_parts,
															   unsigned int&			  out_n_vertex_shader_parts)
{
	/* GL functions */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get maximum number of texture units */
	gl.getIntegerv(GL_MAX_COMBINED_TEXTURE_IMAGE_UNITS, &m_max_combined_texture_units);
	gl.getIntegerv(GL_MAX_VERTEX_TEXTURE_IMAGE_UNITS, &m_max_vertex_texture_units);
	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_TEXTURE_IMAGE_UNITS, &m_max_geometry_texture_units);
	gl.getIntegerv(GL_MAX_TEXTURE_IMAGE_UNITS, &m_max_fragment_texture_units);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() call(s) failed");

	m_n_texture_units =
		de::max(m_max_vertex_texture_units, de::max(m_max_geometry_texture_units, m_max_fragment_texture_units));
	m_n_vertex_texture_units = de::max(1, de::min(m_max_combined_texture_units - 2, m_max_vertex_texture_units));
	m_n_fragment_texture_units =
		de::max(1, de::min(m_max_combined_texture_units - m_n_vertex_texture_units - 1, m_max_fragment_texture_units));
	m_n_geometry_texture_units =
		de::max(1, de::min(m_max_combined_texture_units - m_n_vertex_texture_units - m_n_fragment_texture_units,
						   m_max_geometry_texture_units));
	m_min_texture_units =
		de::min(m_n_vertex_texture_units, de::min(m_n_fragment_texture_units, m_n_geometry_texture_units));

	/* Number of drawn points is equal to GL_MAX_GEOMETRY_TEXTURE_IMAGE_UNITS_EXT */
	m_texture_width = m_n_texture_units * m_point_size;

	/* Prepare texture units string */
	std::stringstream stream_fragment;
	stream_fragment << m_n_fragment_texture_units;
	m_n_fragment_texture_units_string = stream_fragment.str();

	std::stringstream stream_geometry;
	stream_geometry << m_n_geometry_texture_units;
	m_n_geometry_texture_units_string = stream_geometry.str();

	std::stringstream stream_vertex;
	stream_vertex << m_n_vertex_texture_units;
	m_n_vertex_texture_units_string = stream_vertex.str();

	/* Fragment shader parts */
	m_fragment_shader_parts[0] = m_fragment_shader_code_preamble;
	m_fragment_shader_parts[1] = m_n_fragment_texture_units_string.c_str();
	m_fragment_shader_parts[2] = m_fragment_shader_code_body;

	out_fragment_shader_parts   = m_fragment_shader_parts;
	out_n_fragment_shader_parts = 3;

	/* Geometry shader parts */
	m_geometry_shader_parts[0] = m_geometry_shader_code_preamble;
	m_geometry_shader_parts[1] = m_n_geometry_texture_units_string.c_str();
	m_geometry_shader_parts[2] = m_geometry_shader_code_body;

	out_geometry_shader_parts   = m_geometry_shader_parts;
	out_n_geometry_shader_parts = 3;

	/* Vertex shader parts */
	m_vertex_shader_parts[0] = m_vertex_shader_code_preamble;
	m_vertex_shader_parts[1] = m_n_vertex_texture_units_string.c_str();
	m_vertex_shader_parts[2] = m_vertex_shader_code_body;

	out_vertex_shader_parts   = m_vertex_shader_parts;
	out_n_vertex_shader_parts = 3;
}